

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcLightSourceSpot,_4UL>::Construct
                   (DB *db,LIST *params)

{
  IfcLightSourceSpot *in;
  
  in = (IfcLightSourceSpot *)operator_new(0x108);
  *(undefined ***)&in->field_0xf0 = &PTR__Object_00816a50;
  *(undefined8 *)&in->field_0xf8 = 0;
  *(char **)&in->field_0x100 = "IfcLightSourceSpot";
  Assimp::IFC::Schema_2x3::IfcLightSourcePositional::IfcLightSourcePositional
            ((IfcLightSourcePositional *)in,&PTR_construction_vtable_24__008966e0);
  *(undefined8 *)&(in->super_IfcLightSourcePositional).field_0xc0 = 0;
  *(undefined8 *)&(in->super_IfcLightSourcePositional).field_0xc8 = 0;
  (in->super_IfcLightSourcePositional).super_IfcLightSource.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcLightSourceSpot_00896600;
  *(undefined ***)&in->field_0xf0 = &PTR__IfcLightSourceSpot_008966c8;
  *(undefined ***)
   &(in->super_IfcLightSourcePositional).super_IfcLightSource.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcLightSourceSpot_00896628;
  *(undefined ***)
   &(in->super_IfcLightSourcePositional).super_IfcLightSource.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcLightSourceSpot_00896650;
  *(undefined ***)&(in->super_IfcLightSourcePositional).super_IfcLightSource.field_0x80 =
       &PTR__IfcLightSourceSpot_00896678;
  *(undefined ***)&(in->super_IfcLightSourcePositional).field_0xb8 =
       &PTR__IfcLightSourceSpot_008966a0;
  (in->ConcentrationExponent).have = false;
  GenericFill<Assimp::IFC::Schema_2x3::IfcLightSourceSpot>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcLightSourcePositional).super_IfcLightSource.
                 super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                 _vptr_ObjectHelper +
         (long)(in->super_IfcLightSourcePositional).super_IfcLightSource.
               super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
               _vptr_ObjectHelper[0xfffffffffffffffd]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }